

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateCtz(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  undefined4 *puVar4;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar3 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsInt32(pOVar3);
  if (!bVar2) {
    pOVar3 = IR::Instr::GetDst(instr);
    bVar2 = IR::Opnd::IsInt64(pOVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5271,"(instr->GetDst()->IsInt32() || instr->GetDst()->IsInt64())",
                         "instr->GetDst()->IsInt32() || instr->GetDst()->IsInt64()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  pOVar3 = IR::Instr::GetSrc1(instr);
  bVar2 = IR::Opnd::IsInt32(pOVar3);
  if (!bVar2) {
    pOVar3 = IR::Instr::GetSrc1(instr);
    bVar2 = IR::Opnd::IsInt64(pOVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5272,"(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsInt64())",
                         "instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsInt64()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  LowererMD::GenerateCtz(&this->m_lowererMD,instr);
  return;
}

Assistant:

void
Lowerer::GenerateCtz(IR::Instr* instr)
{
    Assert(instr->GetDst()->IsInt32() || instr->GetDst()->IsInt64());
    Assert(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsInt64());
    m_lowererMD.GenerateCtz(instr);
}